

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
               (QWindow *args,unsigned_long args_1,Type args_2,int args_3,
               QFlags<Qt::KeyboardModifier> args_4,uint args_5,uint args_6,uint args_7,
               QString args_8,bool args_9,unsigned_short args_10)

{
  long lVar1;
  QString args_8_00;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  QInputDevice *device;
  long in_FS_OFFSET;
  unsigned_short in_stack_ffffffffffffff08;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  KeyEvent event;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xdb;
  cVar2 = QThread::isMainThread();
  if (cVar2 == '\0') {
    local_f0.d = *(Data **)&(args_8.d.d)->super_QArrayData;
    local_f0.ptr = (char16_t *)((args_8.d.d)->super_QArrayData).alloc;
    local_f0.size._0_4_ = args_8.d.d[1].super_QArrayData.ref_;
    local_f0.size._4_4_ = args_8.d.d[1].super_QArrayData.flags;
    if (local_f0.d != (Data *)0x0) {
      LOCK();
      ((local_f0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    args_8_00.d.ptr._0_1_ = args_8.d.ptr._0_1_;
    args_8_00.d.d = (Data *)&local_f0;
    args_8_00.d.ptr._1_7_ = 0;
    args_8_00.d.size._0_2_ = (ushort)args_8.d.size;
    args_8_00.d.size._2_6_ = 0;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8_00,(bool)uVar3,
               in_stack_ffffffffffffff08);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    uVar3 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
    goto LAB_002fdf55;
  }
  event._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  event._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  event.source = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  event._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.device = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.window.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.timestamp = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.window.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._vptr_WindowSystemEvent =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  device = QInputDevice::primaryKeyboard((QString *)&local_d8);
  QWindowSystemInterfacePrivate::KeyEvent::KeyEvent
            (&event,args,args_1,args_2,args_3,
             (KeyboardModifiers)
             args_4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,args_5,args_6,args_7,(QString *)args_8.d.d,
             args_8.d.ptr._0_1_,(ushort)args_8.d.size,device);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)&event);
LAB_002fdf47:
    uVar3 = event.super_InputEvent.super_UserEvent.super_WindowSystemEvent.eventAccepted;
  }
  else {
    iVar4 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&event);
    if ((char)iVar4 != '\0') goto LAB_002fdf47;
    uVar3 = 0;
  }
  QWindowSystemInterfacePrivate::KeyEvent::~KeyEvent(&event);
LAB_002fdf55:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}